

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::iuUniversalPrinter<std::filesystem::__cxx11::path>::Print
               (path *value,iu_ostream *os)

{
  iu_ostream *os_local;
  path *value_local;
  
  UniversalPrintTo<std::filesystem::__cxx11::path>(value,os);
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }